

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O1

void __thiscall
dynet::NaryTreeLSTMBuilder::new_graph_impl
          (NaryTreeLSTMBuilder *this,ComputationGraph *cg,bool update)

{
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *pvVar1;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *pvVar2;
  Parameter PVar3;
  LookupParameterStorage *pLVar4;
  ulong uVar5;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *this_00;
  pointer pvVar6;
  pointer pvVar7;
  long lVar8;
  uint k;
  Expression EVar9;
  initializer_list<dynet::Expression> __l;
  LookupParameter p;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vals;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  lvars;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vars;
  allocator_type local_171;
  undefined8 local_170;
  ComputationGraph *local_168;
  undefined8 local_160;
  ComputationGraph *local_158;
  undefined8 local_150;
  ComputationGraph *local_148;
  pointer local_140;
  ComputationGraph *local_138;
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  *local_130;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_128;
  ComputationGraph *local_120;
  undefined8 local_118;
  ComputationGraph *local_110;
  undefined8 local_108;
  ComputationGraph *local_100;
  NaryTreeLSTMBuilder *local_f8;
  ulong local_f0;
  LookupParameter local_e8;
  void *local_e0 [3];
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  local_c8;
  undefined8 local_b0;
  ComputationGraph *local_a8;
  undefined8 local_a0;
  ComputationGraph *local_98;
  undefined8 local_90;
  ComputationGraph *local_88;
  undefined8 local_80;
  ComputationGraph *local_78;
  undefined8 local_70;
  ComputationGraph *local_68;
  undefined8 local_60;
  Expression local_58;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_48;
  
  this->cg = cg;
  local_128 = &this->param_vars;
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear(local_128);
  local_130 = &this->lparam_vars;
  pvVar1 = (this->lparam_vars).
           super__Vector_base<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->lparam_vars).
           super__Vector_base<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pvVar1;
  if (pvVar2 != pvVar1) {
    do {
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::~vector(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pvVar2);
    (this->lparam_vars).
    super__Vector_base<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  }
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::reserve(local_128,(ulong)this->layers);
  std::
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  ::reserve(local_130,(ulong)this->layers);
  if (this->layers != 0) {
    uVar5 = 0;
    local_f8 = this;
    do {
      pvVar7 = (this->params).
               super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (this->lparams).
               super__Vector_base<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5;
      PVar3.p = (ParameterStorage *)
                *pvVar7[uVar5].
                 super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_f0 = uVar5;
      if (update) {
        EVar9 = parameter(cg,PVar3);
      }
      else {
        EVar9 = const_parameter(cg,PVar3);
      }
      local_140 = EVar9._8_8_;
      local_138 = EVar9.pg;
      pvVar7 = pvVar7 + uVar5;
      PVar3.p = *(ParameterStorage **)
                 (*(long *)&(pvVar7->
                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>)
                            ._M_impl.super__Vector_impl_data + 8);
      if (update) {
        EVar9 = parameter(cg,PVar3);
      }
      else {
        EVar9 = const_parameter(cg,PVar3);
      }
      local_150 = EVar9._8_8_;
      local_148 = EVar9.pg;
      PVar3.p = *(ParameterStorage **)
                 (*(long *)&(pvVar7->
                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>)
                            ._M_impl.super__Vector_impl_data + 0x10);
      if (update) {
        EVar9 = parameter(cg,PVar3);
      }
      else {
        EVar9 = const_parameter(cg,PVar3);
      }
      local_160 = EVar9._8_8_;
      local_158 = EVar9.pg;
      PVar3.p = *(ParameterStorage **)
                 (*(long *)&(pvVar7->
                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>)
                            ._M_impl.super__Vector_impl_data + 0x18);
      if (update) {
        EVar9 = parameter(cg,PVar3);
      }
      else {
        EVar9 = const_parameter(cg,PVar3);
      }
      local_170 = EVar9._8_8_;
      local_168 = EVar9.pg;
      PVar3.p = *(ParameterStorage **)
                 (*(long *)&(pvVar7->
                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>)
                            ._M_impl.super__Vector_impl_data + 0x20);
      if (update) {
        EVar9 = parameter(cg,PVar3);
      }
      else {
        EVar9 = const_parameter(cg,PVar3);
      }
      local_108 = EVar9._8_8_;
      local_100 = EVar9.pg;
      PVar3.p = *(ParameterStorage **)
                 (*(long *)&(pvVar7->
                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>)
                            ._M_impl.super__Vector_impl_data + 0x28);
      if (update) {
        EVar9 = parameter(cg,PVar3);
      }
      else {
        EVar9 = const_parameter(cg,PVar3);
      }
      local_118 = EVar9._8_8_;
      local_110 = EVar9.pg;
      PVar3.p = *(ParameterStorage **)
                 (*(long *)&(pvVar7->
                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>)
                            ._M_impl.super__Vector_impl_data + 0x30);
      if (update) {
        EVar9 = parameter(cg,PVar3);
      }
      else {
        EVar9 = const_parameter(cg,PVar3);
      }
      local_120 = EVar9.pg;
      PVar3.p = *(ParameterStorage **)
                 (*(long *)&(pvVar7->
                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>)
                            ._M_impl.super__Vector_impl_data + 0x38);
      if (update) {
        local_58 = parameter(cg,PVar3);
      }
      else {
        local_58 = const_parameter(cg,PVar3);
      }
      local_c8.
      super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138;
      local_c8.
      super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_140;
      local_c8.
      super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_148;
      local_b0 = local_150;
      local_a8 = local_158;
      local_a0 = local_160;
      local_98 = local_168;
      local_90 = local_170;
      local_88 = local_100;
      local_80 = local_108;
      local_78 = local_110;
      local_70 = local_118;
      local_68 = local_120;
      __l._M_len = 8;
      __l._M_array = (iterator)&local_c8;
      local_60 = EVar9._8_8_;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                (&local_48,__l,(allocator_type *)local_e0);
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::push_back(local_128,&local_48);
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::vector(&local_c8,
               (long)*(pointer *)
                      ((long)&(pvVar6->
                              super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                              )._M_impl.super__Vector_impl_data + 8) -
               *(long *)&(pvVar6->
                         super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                         )._M_impl.super__Vector_impl_data >> 3,(allocator_type *)local_e0);
      lVar8 = 0;
      do {
        local_e8.p = *(LookupParameterStorage **)
                      (*(long *)&(pvVar6->
                                 super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                                 )._M_impl.super__Vector_impl_data + lVar8 * 8);
        pLVar4 = LookupParameter::get_storage(&local_e8);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_e0,
                   (long)(pLVar4->values).
                         super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pLVar4->values).
                         super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6,&local_171);
        for (uVar5 = 0; pLVar4 = LookupParameter::get_storage(&local_e8),
            uVar5 < (ulong)((long)(pLVar4->values).
                                  super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pLVar4->values).
                                  super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 6);
            uVar5 = (ulong)((int)uVar5 + 1)) {
          *(undefined4 *)((long)local_e0[0] + uVar5 * 0x10 + 8) = 0;
        }
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator=
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                   ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)
                    &(local_c8.
                      super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> +
                   lVar8),(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_e0)
        ;
        if (local_e0[0] != (void *)0x0) {
          operator_delete(local_e0[0]);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 7);
      std::
      vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
      ::push_back(local_130,&local_c8);
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::~vector(&local_c8);
      this = local_f8;
      if (local_48.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar5 = local_f0 + 1;
    } while (uVar5 < this->layers);
  }
  return;
}

Assistant:

void NaryTreeLSTMBuilder::new_graph_impl(ComputationGraph& cg, bool update) {
  this->cg = &cg;
  param_vars.clear();
  lparam_vars.clear();
  param_vars.reserve(layers);
  lparam_vars.reserve(layers);

  for (unsigned i = 0; i < layers; ++i){
    auto& p = params[i];
    auto& lp = lparams[i];

    //i
    Expression i_x2i = update ? parameter(cg, p[X2I]) : const_parameter(cg, p[X2I]);
    Expression i_bi = update ? parameter(cg, p[BI]) : const_parameter(cg, p[BI]);
    //f
    Expression i_x2f = update ? parameter(cg, p[X2F]) : const_parameter(cg, p[X2F]);
    Expression i_bf = update ? parameter(cg, p[BF]) : const_parameter(cg, p[BF]);
    //o
    Expression i_x2o = update ? parameter(cg, p[X2O]) : const_parameter(cg, p[X2O]);
    Expression i_bo = update ? parameter(cg, p[BO]) : const_parameter(cg, p[BO]);
    //c
    Expression i_x2c = update ? parameter(cg, p[X2C]) : const_parameter(cg, p[X2C]);
    Expression i_bc = update ? parameter(cg, p[BC]) : const_parameter(cg, p[BC]);

    vector<Expression> vars = {i_x2i, i_bi, i_x2f, i_bf, i_x2o, i_bo, i_x2c, i_bc};
    param_vars.push_back(vars);

    DYNET_ASSERT(lp.size() == C2O + 1, "Dimension mismatch in TreeLSTM");
    vector<vector<Expression>> lvars(lp.size());
    for (unsigned p_type = H2I; p_type <= C2O; p_type++) {
    LookupParameter p = lp[p_type];
      vector<Expression> vals(p.get_storage().values.size());
      for (unsigned k = 0; k < p.get_storage().values.size(); ++k) {
        //vals[k] = lookup(cg, p, k);
        vals[k].i = 0;
      }
      lvars[p_type] = vals;
    }
    lparam_vars.push_back(lvars);
  }
}